

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>_>_>
* __thiscall
Lib::
coproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>
          (IterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>_>_>
           *__return_storage_ptr__,Lib *this,
          Coproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>
          *is)

{
  CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>_>_>_>_>
  *i;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>_>
  DStack_48;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>_>
  local_2c;
  
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>_>
  ::DefaultImpl(&local_2c,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>_>
                 *)this);
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>_>
  ::DefaultImpl(&DStack_48,&local_2c);
  iterTraits<Lib::CoproductIter<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>>
            (__return_storage_ptr__,(Lib *)&DStack_48,i);
  CoproductImpl::
  RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>
              *)&DStack_48,
             &DStack_48.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>_>_>_>
            );
  CoproductImpl::
  RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>,Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::BinaryResolutionConf::Rhs>>>>>>
              *)&local_2c,(anon_class_8_1_8991fb9c)&local_2c);
  return __return_storage_ptr__;
}

Assistant:

auto coproductIter(Coproduct<Is...> is)
{ return iterTraits(CoproductIter<Is...>(std::move(is))); }